

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O3

void asio::detail::
     reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor,_void>
  w;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>
  handler;
  ptr local_138;
  any_executor_base local_120;
  func_type local_f0;
  undefined1 local_e8 [184];
  error_category *peStack_30;
  scheduler_operation *local_28;
  
  local_138.v = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
                 *)base;
  local_138.p = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
                 *)base;
  execution::detail::any_executor_base::any_executor_base
            (&local_120,(any_executor_base *)&base[0xb].func_);
  local_f0 = base[0xd].func_;
  base[0xd].func_ =
       (func_type)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_e8._0_8_ = base[4].next_;
  local_e8._8_8_ = base[4].func_;
  local_e8._16_8_ = *(undefined8 *)&base[4].task_result_;
  local_e8._24_8_ = base[5].next_;
  local_e8._32_4_ = *(undefined4 *)&base[5].func_;
  asio::ssl::detail::
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
  ::io_op((io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
           *)(local_e8 + 0x28),
          (io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>
           *)&base[5].task_result_);
  local_e8._176_8_ = base[1].next_;
  peStack_30 = (error_category *)base[1].func_;
  local_28 = base[2].next_;
  local_138.h = (write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>
                 *)local_e8;
  ptr::reset(&local_138);
  if (owner != (void *)0x0) {
    handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>>,asio::any_io_executor,void>
    ::
    complete<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>>,std::error_code,unsigned_long>>
              ((handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>>,asio::any_io_executor,void>
                *)&local_120,
               (binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>
                *)local_e8,
               (write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>
                *)local_e8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._160_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._160_8_);
  }
  if ((_Manager_type)local_e8._136_8_ != (_Manager_type)0x0) {
    (*(code *)local_e8._136_8_)
              ((_Any_data *)(local_e8 + 0x78),(_Any_data *)(local_e8 + 0x78),__destroy_functor);
  }
  (*(local_120.object_fns_)->destroy)(&local_120);
  ptr::reset(&local_138);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_send_op* o(static_cast<reactive_socket_send_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }